

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

int __thiscall
AbstractModuleClient::processEventMsg
          (AbstractModuleClient *this,char *sender,char *event,TrodesMsg *msg)

{
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  int rc;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  int local_24;
  undefined8 local_20;
  char *local_18;
  
  local_24 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_RSI,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,local_18,&local_81);
  (**(code **)(*in_RDI + 0x80))(in_RDI,local_48,local_80,local_20);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return local_24;
}

Assistant:

int AbstractModuleClient::processEventMsg(const char *sender, const char *event, TrodesMsg &msg) {
    int rc = 0;
//    std::cout << "got event msg with " << msg.numContents() << "frames\n";
    recv_event(sender, event, msg);
    return rc;
}